

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

absolute_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::LocalTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,int_fast64_t unix_time,
          Transition *tr)

{
  pointer pTVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  fields fVar5;
  
  pTVar1 = (this->transition_types_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((uint)tr->type_index * 0x30);
  uVar2._0_1_ = (tr->civil_sec).f_.m;
  uVar2._1_1_ = (tr->civil_sec).f_.d;
  uVar2._2_1_ = (tr->civil_sec).f_.hh;
  uVar2._3_1_ = (tr->civil_sec).f_.mm;
  uVar2._4_1_ = (tr->civil_sec).f_.ss;
  uVar2._5_3_ = *(undefined3 *)&(tr->civil_sec).f_.field_0xd;
  fVar5 = detail::step((tr->civil_sec).f_.y,uVar2,unix_time - tr->unix_time);
  uVar3 = fVar5._8_8_ & 0xffffffffff;
  (__return_storage_ptr__->cs).f_.y = fVar5.y;
  (__return_storage_ptr__->cs).f_.m = (char)uVar3;
  (__return_storage_ptr__->cs).f_.d = (char)(uVar3 >> 8);
  (__return_storage_ptr__->cs).f_.hh = (char)(uVar3 >> 0x10);
  (__return_storage_ptr__->cs).f_.mm = (char)(uVar3 >> 0x18);
  (__return_storage_ptr__->cs).f_.ss = (char)(uVar3 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->cs).f_.field_0xd = (int3)(uVar3 >> 0x28);
  __return_storage_ptr__->offset = *(int *)((long)&pTVar1->utc_offset + uVar4);
  __return_storage_ptr__->is_dst = (&pTVar1->is_dst)[uVar4];
  __return_storage_ptr__->abbr =
       (this->abbreviations_)._M_dataplus._M_p + (&pTVar1->abbr_index)[uVar4];
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::LocalTime(std::int_fast64_t unix_time,
                                                   const Transition& tr) const {
  const TransitionType& tt = transition_types_[tr.type_index];
  // Note: (unix_time - tr.unix_time) will never overflow as we
  // have ensured that there is always a "nearby" transition.
  return {tr.civil_sec + (unix_time - tr.unix_time),  // TODO: Optimize.
          tt.utc_offset, tt.is_dst, &abbreviations_[tt.abbr_index]};
}